

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O3

schedule_t worker_runnable(__cilkrts_worker *w)

{
  local_state *plVar1;
  schedule_t sVar2;
  uint uVar3;
  
  plVar1 = w->l;
  sVar2 = SCHEDULE_RUN;
  if (plVar1->next_frame_ff == (full_frame *)0x0) {
    sVar2 = SCHEDULE_EXIT;
    if (w->g->work_done == 0) {
      if (w->self == 0) {
        if (w->g->max_steal_failures < plVar1->steal_failure_count) {
          uVar3 = signal_node_should_wait(plVar1->signal_node);
          if (uVar3 != 0) {
            return SCHEDULE_WAIT;
          }
          w->l->steal_failure_count = 0;
        }
      }
      else if ((plVar1->type == WORKER_SYSTEM) &&
              (uVar3 = signal_node_should_wait(plVar1->signal_node), uVar3 != 0)) {
        return SCHEDULE_WAIT;
      }
      sVar2 = SCHEDULE_RUN;
    }
  }
  return sVar2;
}

Assistant:

schedule_t worker_runnable(__cilkrts_worker *w)
{
    global_state_t *g = w->g;

    /* If this worker has something to do, do it.
       Otherwise the work would be lost. */
    if (w->l->next_frame_ff)
        return SCHEDULE_RUN;

    // If Cilk has explicitly (by the user) been told to exit (i.e., by
    // __cilkrts_end_cilk() -> __cilkrts_stop_workers(g)), then return 0.
    if (g->work_done)
        return SCHEDULE_EXIT;

    if (0 == w->self) {
        // This worker is the root node and is the only one that may query the
        // global state to see if there are still any user workers in Cilk.
        if (w->l->steal_failure_count > g->max_steal_failures) {
            if (signal_node_should_wait(w->l->signal_node)) {
                return SCHEDULE_WAIT;
            } else {
                // Reset the steal_failure_count since we have verified that
                // user workers are still in Cilk.
                w->l->steal_failure_count = 0;
            }
        }
    } else if (WORKER_SYSTEM == w->l->type &&
               signal_node_should_wait(w->l->signal_node)) {
        // This worker has been notified by its parent that it should stop
        // trying to steal.
        return SCHEDULE_WAIT;
    }

    return SCHEDULE_RUN;
}